

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_timesplit_array.h
# Opt level: O1

Split * __thiscall
embree::avx::
HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::avx::GridRecalculatePrimRef,_2UL>::find
          (Split *__return_storage_ptr__,
          HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::avx::GridRecalculatePrimRef,_2UL>
          *this,SetMB *set,size_t logBlockSize)

{
  size_t begin;
  size_t end;
  char cVar1;
  runtime_error *this_00;
  anon_class_32_4_7a9d95a5 bin;
  task_group_context context;
  task_group_context *context_00;
  BBox1f local_2c0;
  TemporalBinInfo local_2b8;
  undefined1 *local_228;
  BBox1f *local_220;
  SetMB *local_218;
  GridRecalculatePrimRef *local_210;
  undefined1 local_208 [32];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1e8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1d8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1c8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1b8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1a8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_198;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_188;
  undefined8 local_178;
  undefined8 uStack_170;
  size_t local_160;
  size_t local_158;
  undefined8 local_150;
  task_group_context local_148;
  blocked_range<unsigned_long> local_c8;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_2b8.count0[0] = 0;
  local_2b8.count1[0] = 0;
  local_2b8.bounds1[0].bounds0.lower.field_0._0_8_ = 0x7f8000007f800000;
  local_2b8.bounds1[0].bounds0.lower.field_0._8_8_ = 0x7f8000007f800000;
  local_2b8.bounds1[0].bounds0.upper.field_0._0_8_ = 0xff800000ff800000;
  local_2b8.bounds1[0].bounds0.upper.field_0._8_8_ = 0xff800000ff800000;
  local_2b8.bounds1[0].bounds1.lower.field_0._0_8_ = 0x7f8000007f800000;
  local_2b8.bounds1[0].bounds1.lower.field_0._8_8_ = 0x7f8000007f800000;
  local_2b8.bounds1[0].bounds1.upper.field_0._0_8_ = 0xff800000ff800000;
  local_2b8.bounds1[0].bounds1.upper.field_0._8_8_ = 0xff800000ff800000;
  local_2b8.bounds0[0].bounds0.lower.field_0._0_8_ = 0x7f8000007f800000;
  local_2b8.bounds0[0].bounds0.lower.field_0._8_8_ = 0x7f8000007f800000;
  local_2b8.bounds0[0].bounds0.upper.field_0._0_8_ = 0xff800000ff800000;
  local_2b8.bounds0[0].bounds0.upper.field_0._8_8_ = 0xff800000ff800000;
  local_2b8.bounds0[0].bounds1.lower.field_0._0_8_ = 0x7f8000007f800000;
  local_2b8.bounds0[0].bounds1.lower.field_0._8_8_ = 0x7f8000007f800000;
  local_2b8.bounds0[0].bounds1.upper.field_0._0_8_ = 0xff800000ff800000;
  local_2b8.bounds0[0].bounds1.upper.field_0._8_8_ = 0xff800000ff800000;
  context_00 = (task_group_context *)set->prims->items;
  begin = (set->super_PrimInfoMB).object_range._begin;
  end = (set->super_PrimInfoMB).object_range._end;
  local_2c0 = (set->super_PrimInfoMB).time_range;
  if (end - begin < 0xc00) {
    TemporalBinInfo::bin
              (&local_2b8,(PrimRefMB *)context_00,begin,end,local_2c0,set,&this->recalculatePrimRef)
    ;
  }
  else {
    local_220 = &local_2c0;
    local_c8.my_end = 0;
    local_c8.my_begin = 0;
    local_78 = 0x7f800000;
    uStack_74 = 0x7f800000;
    uStack_70 = 0x7f800000;
    uStack_6c = 0x7f800000;
    local_68 = 0xff800000;
    uStack_64 = 0xff800000;
    uStack_60 = 0xff800000;
    uStack_5c = 0xff800000;
    local_58 = 0x7f800000;
    uStack_54 = 0x7f800000;
    uStack_50 = 0x7f800000;
    uStack_4c = 0x7f800000;
    local_48 = 0xff800000;
    uStack_44 = 0xff800000;
    uStack_40 = 0xff800000;
    uStack_3c = 0xff800000;
    local_c8.my_grainsize._0_4_ = 0x7f800000;
    local_c8.my_grainsize._4_4_ = 0x7f800000;
    uStack_b0 = 0x7f800000;
    uStack_ac = 0x7f800000;
    local_a8 = 0xff800000;
    uStack_a4 = 0xff800000;
    uStack_a0 = 0xff800000;
    uStack_9c = 0xff800000;
    local_98 = 0x7f800000;
    uStack_94 = 0x7f800000;
    uStack_90 = 0x7f800000;
    uStack_8c = 0x7f800000;
    local_88 = 0xff800000;
    uStack_84 = 0xff800000;
    uStack_80 = 0xff800000;
    uStack_7c = 0xff800000;
    local_148.my_version = proxy_support;
    local_148.my_traits = (context_traits)0x4;
    local_148.my_node.my_prev_node = (intrusive_list_node *)0x0;
    local_148.my_node.my_next_node = (intrusive_list_node *)0x0;
    local_148.my_name = CUSTOM_CTX;
    local_228 = &stack0xfffffffffffffd38;
    local_218 = set;
    local_210 = &this->recalculatePrimRef;
    tbb::detail::r1::initialize(&local_148);
    local_150 = 0x400;
    local_208._0_8_ = TemporalBinInfo::merge2;
    local_208._8_8_ = &local_228;
    local_160 = end;
    local_158 = begin;
    tbb::detail::d1::
    parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::GridRecalculatePrimRef,2ul>::TemporalBinInfo,embree::parallel_reduce<unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::GridRecalculatePrimRef,2ul>::TemporalBinInfo,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::GridRecalculatePrimRef,2ul>::TemporalBinInfo::bin_parallel(embree::PrimRefMB_const*,unsigned_long,unsigned_long,unsigned_long,unsigned_long,embree::BBox<float>,embree::SetMB_const&,embree::avx::GridRecalculatePrimRef_const&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::GridRecalculatePrimRef,2ul>::TemporalBinInfo_const(embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::GridRecalculatePrimRef,2ul>::TemporalBinInfo_const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::Gr___urTemporalSplit<embree::PrimRefMB,embree::avx::GridRecalculatePrimRef,2ul>::TemporalBinInfo_const&)>
              ((TemporalBinInfo *)(local_208 + 0x10),(d1 *)&local_160,&local_c8,
               (TemporalBinInfo *)local_208,
               (anon_class_16_2_ed117de8_conflict19 *)TemporalBinInfo::merge2,
               (_func_TemporalBinInfo_TemporalBinInfo_ptr_TemporalBinInfo_ptr *)&local_148,
               context_00);
    cVar1 = tbb::detail::r1::is_group_execution_cancelled(&local_148);
    if (cVar1 != '\0') {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"task cancelled");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_148);
    local_2b8.count0[0] = local_208._16_8_;
    local_2b8.count1[0] = local_208._24_8_;
    local_2b8.bounds0[0].bounds0.lower.field_0._0_8_ = local_1e8._0_8_;
    local_2b8.bounds0[0].bounds0.lower.field_0._8_8_ = local_1e8._8_8_;
    local_2b8.bounds0[0].bounds0.upper.field_0._0_8_ = local_1d8._0_8_;
    local_2b8.bounds0[0].bounds0.upper.field_0._8_8_ = local_1d8._8_8_;
    local_2b8.bounds0[0].bounds1.lower.field_0._0_8_ = aStack_1c8._0_8_;
    local_2b8.bounds0[0].bounds1.lower.field_0._8_8_ = aStack_1c8._8_8_;
    local_2b8.bounds0[0].bounds1.upper.field_0._0_8_ = local_1b8._0_8_;
    local_2b8.bounds0[0].bounds1.upper.field_0._8_8_ = local_1b8._8_8_;
    local_2b8.bounds1[0].bounds0.lower.field_0._0_8_ = aStack_1a8._0_8_;
    local_2b8.bounds1[0].bounds0.lower.field_0._8_8_ = aStack_1a8._8_8_;
    local_2b8.bounds1[0].bounds0.upper.field_0._0_8_ = local_198._0_8_;
    local_2b8.bounds1[0].bounds0.upper.field_0._8_8_ = local_198._8_8_;
    local_2b8.bounds1[0].bounds1.lower.field_0._0_8_ = aStack_188._0_8_;
    local_2b8.bounds1[0].bounds1.lower.field_0._8_8_ = aStack_188._8_8_;
    local_2b8.bounds1[0].bounds1.upper.field_0._0_8_ = local_178;
    local_2b8.bounds1[0].bounds1.upper.field_0._8_8_ = uStack_170;
  }
  TemporalBinInfo::best
            (__return_storage_ptr__,&local_2b8,(int)logBlockSize,(set->super_PrimInfoMB).time_range,
             set);
  if (__return_storage_ptr__->dim == -1) {
    __return_storage_ptr__->data = 1;
  }
  return __return_storage_ptr__;
}

Assistant:

const Split find(const SetMB& set, const size_t logBlockSize)
        {
          assert(set.size() > 0);
          TemporalBinInfo binner(empty);
          binner.bin_parallel(set.prims->data(),set.begin(),set.end(),PARALLEL_FIND_BLOCK_SIZE,PARALLEL_THRESHOLD,set.time_range,set,recalculatePrimRef);
          Split tsplit = binner.best((int)logBlockSize,set.time_range,set);
          if (!tsplit.valid()) tsplit.data = Split::SPLIT_FALLBACK; // use fallback split
          return tsplit;
        }